

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

void __thiscall
Builder::Builder(Builder *this,State *state,BuildConfig *config,BuildLog *build_log,
                DepsLog *deps_log,DiskInterface *disk_interface)

{
  BuildConfig *pBVar1;
  BuildStatus *this_00;
  
  this->state_ = state;
  this->config_ = config;
  Plan::Plan(&this->plan_,this);
  (this->command_runner_)._M_t.
  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = (CommandRunner *)0x0;
  this->disk_interface_ = disk_interface;
  pBVar1 = this->config_;
  (this->scan_).build_log_ = build_log;
  (this->scan_).disk_interface_ = disk_interface;
  (this->scan_).dep_loader_.state_ = state;
  (this->scan_).dep_loader_.disk_interface_ = disk_interface;
  (this->scan_).dep_loader_.deps_log_ = deps_log;
  (this->scan_).dep_loader_.depfile_parser_options_ = (DepfileParserOptions *)(pBVar1 + 0x18);
  (this->scan_).dyndep_loader_.state_ = state;
  (this->scan_).dyndep_loader_.disk_interface_ = disk_interface;
  this_00 = (BuildStatus *)operator_new(0x128);
  BuildStatus::BuildStatus(this_00,config);
  this->status_ = this_00;
  return;
}

Assistant:

Builder::Builder(State* state, const BuildConfig& config,
                 BuildLog* build_log, DepsLog* deps_log,
                 DiskInterface* disk_interface)
    : state_(state), config_(config),
      plan_(this), disk_interface_(disk_interface),
      scan_(state, build_log, deps_log, disk_interface,
            &config_.depfile_parser_options) {
  status_ = new BuildStatus(config);
}